

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

double Js::JavascriptNumber::DirectPow(double x,double y)

{
  bool bVar1;
  uint32 *puVar2;
  int32 local_14;
  double dStack_10;
  int32 intY;
  double y_local;
  
  if ((y != 1.0) || (NAN(y))) {
    dStack_10 = y;
    puVar2 = NumberUtilities::LuLoDbl(&stack0xfffffffffffffff0);
    if ((*puVar2 == 0) &&
       (puVar2 = NumberUtilities::LuHiDbl(&stack0xfffffffffffffff0), (*puVar2 & 0x7fffffff) == 0)) {
      return 1.0;
    }
    if (((ABS(x) == 1.0) && (!NAN(ABS(x)))) &&
       (bVar1 = NumberUtilities::IsFinite(dStack_10), !bVar1)) {
      return NAN;
    }
    bVar1 = TryGetInt32Value<false>(dStack_10,&local_14);
    if (bVar1) {
      x = DirectPowDoubleInt(x,local_14);
    }
    else {
      x = pow(x,dStack_10);
    }
  }
  return x;
}

Assistant:

double JavascriptNumber::DirectPow(double x, double y)
    {
        if(y == 1.0)
        {
            return x;
        }

        // For AMD64/ARM calling convention already uses SSE2/VFP registers so we don't have to use assembler.
        // We can't just use "if (0 == y)" because NaN compares
        // equal to 0 according to our compilers.
        int32 intY;
        if (0 == NumberUtilities::LuLoDbl(y) && 0 == (NumberUtilities::LuHiDbl(y) & 0x7FFFFFFF))
        {
            // pow(x, 0) = 1 even if x is NaN.
            return 1;
        }
        else if (1.0 == fabs(x) && !NumberUtilities::IsFinite(y))
        {
            // pow([+/-] 1, Infinity) = NaN according to javascript, but not for CRT pow.
            return JavascriptNumber::NaN;
        }
        else if (TryGetInt32Value(y, &intY))
        {
            // check fast path
            return DirectPowDoubleInt(x, intY);
        }

        return ::pow(x, y);
    }